

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLineShape.h
# Opt level: O3

void __thiscall chrono::ChLineShape::~ChLineShape(ChLineShape *this)

{
  ~ChLineShape(this);
  free(*(void **)&this[-1].npoints);
  return;
}

Assistant:

virtual ~ChLineShape() {}